

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::insert
          (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this,
          TypedID<(diligent_spirv_cross::Types)0> *itr,
          TypedID<(diligent_spirv_cross::Types)0> *insert_begin,
          TypedID<(diligent_spirv_cross::Types)0> *insert_end)

{
  uint32_t *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pAVar5;
  long lVar6;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar7;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar8;
  size_t __n;
  long lVar10;
  AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pAVar11;
  size_t sVar12;
  TypedID<(diligent_spirv_cross::Types)0> *__ptr;
  ulong uVar13;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar9;
  
  uVar13 = (long)insert_end - (long)insert_begin >> 2;
  __ptr = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
          ptr;
  sVar12 = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
           buffer_size;
  pTVar9 = __ptr + sVar12;
  uVar4 = sVar12 + uVar13;
  if (pTVar9 == itr) {
    reserve(this,uVar4);
    sVar12 = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
             ).buffer_size;
    if (insert_end != insert_begin) {
      pTVar9 = (this->
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr
      ;
      lVar10 = 0;
      do {
        pTVar9[sVar12 + lVar10].id = insert_begin[lVar10].id;
        lVar10 = lVar10 + 1;
      } while (uVar13 + (uVar13 == 0) != lVar10);
    }
  }
  else if (this->buffer_capacity < uVar4) {
    uVar2 = 8;
    if (8 < uVar4) {
      uVar2 = uVar4;
    }
    do {
      uVar4 = uVar2;
      uVar2 = uVar4 * 2;
    } while (uVar4 < uVar13);
    if (uVar4 < 9) {
      pAVar5 = &this->stack_storage;
    }
    else {
      pAVar5 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
               malloc(uVar4 * 4);
      if (pAVar5 == (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                     *)0x0) {
        ::std::terminate();
      }
    }
    pTVar7 = __ptr;
    pAVar11 = pAVar5;
    if (__ptr != itr &&
        pAVar5 != (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)__ptr) {
      do {
        *(uint32_t *)pAVar11->aligned_char = pTVar7->id;
        pTVar7 = pTVar7 + 1;
        pAVar11 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)((long)pAVar11->aligned_char + 4);
      } while (pTVar7 != itr);
    }
    pTVar8 = insert_begin;
    if (insert_begin != insert_end) {
      do {
        *(uint32_t *)pAVar11->aligned_char = pTVar8->id;
        pTVar8 = pTVar8 + 1;
        pAVar11 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)((long)pAVar11->aligned_char + 4);
      } while (pTVar8 != insert_end);
    }
    if (pTVar7 != pTVar9 &&
        (pAVar5 != (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                    *)__ptr || insert_begin != insert_end)) {
      do {
        *(uint32_t *)pAVar11->aligned_char = pTVar7->id;
        pTVar7 = pTVar7 + 1;
        pAVar11 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)((long)pAVar11->aligned_char + 4);
      } while (pTVar7 != pTVar9);
    }
    if ((AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)__ptr
        != &this->stack_storage) {
      free(__ptr);
      sVar12 = (this->
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
               buffer_size;
    }
    (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr =
         (TypedID<(diligent_spirv_cross::Types)0> *)pAVar5;
    this->buffer_capacity = uVar4;
  }
  else {
    lVar10 = ((long)insert_end - (long)insert_begin) + (long)pTVar9;
    if (insert_end != insert_begin) {
      lVar3 = 0;
      do {
        lVar6 = lVar3;
        *(undefined4 *)(lVar10 + -4 + lVar6) = *(undefined4 *)((long)&pTVar9[-1].id + lVar6);
        if ((long)insert_begin + (4 - (long)insert_end) == lVar6) break;
        lVar3 = lVar6 + -4;
      } while ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&pTVar9[-1].id + lVar6) != itr);
      pTVar9 = (TypedID<(diligent_spirv_cross::Types)0> *)((long)&pTVar9[-1].id + lVar6);
      lVar10 = lVar10 + lVar6 + -4;
    }
    __n = (long)pTVar9 - (long)itr;
    if (__n != 0) {
      memmove((void *)(lVar10 - __n),itr,__n);
      __ptr = (this->
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr;
      sVar12 = (this->
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
               buffer_size;
    }
    if (__ptr + sVar12 != itr && insert_end != insert_begin) {
      do {
        puVar1 = &insert_begin->id;
        insert_begin = insert_begin + 1;
        itr->id = *puVar1;
        itr = itr + 1;
        if (itr == __ptr + sVar12) break;
      } while (insert_begin != insert_end);
    }
    for (; insert_begin != insert_end; insert_begin = insert_begin + 1) {
      itr->id = insert_begin->id;
      itr = itr + 1;
    }
  }
  (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
  buffer_size = sVar12 + uVar13;
  return;
}

Assistant:

void insert(T *itr, const T *insert_begin, const T *insert_end) SPIRV_CROSS_NOEXCEPT
	{
		auto count = size_t(insert_end - insert_begin);
		if (itr == this->end())
		{
			reserve(this->buffer_size + count);
			for (size_t i = 0; i < count; i++, insert_begin++)
				new (&this->ptr[this->buffer_size + i]) T(*insert_begin);
			this->buffer_size += count;
		}
		else
		{
			if (this->buffer_size + count > buffer_capacity)
			{
				auto target_capacity = this->buffer_size + count;
				if (target_capacity == 0)
					target_capacity = 1;
				if (target_capacity < N)
					target_capacity = N;

				while (target_capacity < count)
					target_capacity <<= 1u;

				// Need to allocate new buffer. Move everything to a new buffer.
				T *new_buffer =
				    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

				// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
				if (!new_buffer)
					std::terminate();

				// First, move elements from source buffer to new buffer.
				// We don't deal with types which can throw in move constructor.
				auto *target_itr = new_buffer;
				auto *original_source_itr = this->begin();

				if (new_buffer != this->ptr)
				{
					while (original_source_itr != itr)
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				// Copy-construct new elements.
				for (auto *source_itr = insert_begin; source_itr != insert_end; ++source_itr, ++target_itr)
					new (target_itr) T(*source_itr);

				// Move over the other half.
				if (new_buffer != this->ptr || insert_begin != insert_end)
				{
					while (original_source_itr != this->end())
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				if (this->ptr != stack_storage.data())
					free(this->ptr);
				this->ptr = new_buffer;
				buffer_capacity = target_capacity;
			}
			else
			{
				// Move in place, need to be a bit careful about which elements are constructed and which are not.
				// Move the end and construct the new elements.
				auto *target_itr = this->end() + count;
				auto *source_itr = this->end();
				while (target_itr != this->end() && source_itr != itr)
				{
					--target_itr;
					--source_itr;
					new (target_itr) T(std::move(*source_itr));
				}

				// For already constructed elements we can move-assign.
				std::move_backward(itr, source_itr, target_itr);

				// For the inserts which go to already constructed elements, we can do a plain copy.
				while (itr != this->end() && insert_begin != insert_end)
					*itr++ = *insert_begin++;

				// For inserts into newly allocated memory, we must copy-construct instead.
				while (insert_begin != insert_end)
				{
					new (itr) T(*insert_begin);
					++itr;
					++insert_begin;
				}
			}

			this->buffer_size += count;
		}
	}